

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationBasicEventTests.cpp
# Opt level: O3

TestStatus *
vkt::synchronization::anon_unknown_0::deviceWaitForEventCase
          (TestStatus *__return_storage_ptr__,Context *context)

{
  undefined8 obj;
  deUint32 queueFamilyIndex;
  VkResult result;
  int iVar1;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue pVVar2;
  Move<vk::Handle<(vk::HandleType)10>_> local_138;
  VkCommandBuffer local_118;
  long *plStack_110;
  deUint32 local_108;
  undefined4 uStack_104;
  VkSemaphore *pVStack_100;
  VkFence local_f8;
  Deleter<vk::Handle<(vk::HandleType)6>_> DStack_f0;
  VkEvent local_d8;
  Deleter<vk::Handle<(vk::HandleType)10>_> DStack_d0;
  VkSubmitInfo submitInfo;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_60;
  VkEventCreateInfo eventInfo;
  
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  pVVar2 = Context::getUniversalQueue(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&submitInfo,vk,device,0,
                    (VkAllocationCallbacks *)0x0);
  DStack_f0.m_device = (VkDevice)submitInfo._16_8_;
  DStack_f0.m_allocator = (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
  local_f8.m_internal = submitInfo._0_8_;
  DStack_f0.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&submitInfo,vk,device,2,queueFamilyIndex,
             (VkAllocationCallbacks *)0x0);
  obj = submitInfo._0_8_;
  DStack_60.m_device = (VkDevice)submitInfo._16_8_;
  DStack_60.m_allocator = (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
  DStack_60.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&submitInfo,vk,device,
                    (VkCommandPool)submitInfo._0_8_);
  submitInfo.pCommandBuffers = &local_118;
  local_108 = submitInfo.waitSemaphoreCount;
  uStack_104 = submitInfo._20_4_;
  pVStack_100 = submitInfo.pWaitSemaphores;
  local_118 = (VkCommandBuffer)submitInfo._0_8_;
  plStack_110 = (long *)submitInfo.pNext;
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  eventInfo.flags = 0;
  eventInfo._20_4_ = 0;
  eventInfo.sType = VK_STRUCTURE_TYPE_EVENT_CREATE_INFO;
  eventInfo._4_4_ = 0;
  eventInfo.pNext = (void *)0x0;
  ::vk::createEvent(&local_138,vk,device,&eventInfo,(VkAllocationCallbacks *)0x0);
  DStack_d0.m_device =
       local_138.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device;
  DStack_d0.m_allocator =
       local_138.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator;
  local_d8.m_internal =
       local_138.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal;
  DStack_d0.m_deviceIface =
       local_138.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_deviceIface;
  beginCommandBuffer(vk,local_118);
  (*vk->_vptr_DeviceInterface[0x6c])(vk,local_118,1,&local_d8,0x4000,0x10000,0,0,0,0,0,0);
  endCommandBuffer(vk,local_118);
  result = (*vk->_vptr_DeviceInterface[2])(vk,pVVar2,1,&submitInfo,local_f8.m_internal);
  ::vk::checkResult(result,"vk.queueSubmit(queue, 1u, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicEventTests.cpp"
                    ,0x9e);
  iVar1 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,&local_f8,1,1000);
  if (iVar1 == 2) {
    iVar1 = (*vk->_vptr_DeviceInterface[0x1c])(vk,device,local_d8.m_internal);
    if (iVar1 == 0) {
      iVar1 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,&local_f8,1,0xffffffffffffffff);
      local_138.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal =
           (deUint64)
           &local_138.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device;
      if (iVar1 == 0) {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_138,"Device wait for event tests pass","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,
                   local_138.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal
                   ,(long)&(local_138.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.
                           m_deviceIface)->_vptr_DeviceInterface +
                    local_138.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.
                    m_internal);
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_138,"Queue should end execution","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,
                   local_138.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal
                   ,(long)&(local_138.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.
                           m_deviceIface)->_vptr_DeviceInterface +
                    local_138.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.
                    m_internal);
      }
    }
    else {
      local_138.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal =
           (deUint64)
           &local_138.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"Couldn\'t set event","")
      ;
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,
                 local_138.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal,
                 (long)&(local_138.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.
                        m_deviceIface)->_vptr_DeviceInterface +
                 local_138.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal);
    }
  }
  else {
    local_138.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal =
         (deUint64)&local_138.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device
    ;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,"Queue should not end execution","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,
               local_138.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal,
               (long)&(local_138.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.
                      m_deviceIface)->_vptr_DeviceInterface +
               local_138.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal);
  }
  if ((VkDevice *)local_138.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal
      != &local_138.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device) {
    operator_delete((void *)local_138.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.
                            m_internal,
                    (ulong)(local_138.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.
                            m_device + 1));
  }
  if (local_d8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)10>_>::operator()(&DStack_d0,local_d8);
  }
  if (local_118 != (VkCommandBuffer)0x0) {
    submitInfo._0_8_ = local_118;
    (**(code **)(*plStack_110 + 0x240))(plStack_110,_local_108,pVStack_100,1);
  }
  if (obj != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&DStack_60,(VkCommandPool)obj);
  }
  if (local_f8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()(&DStack_f0,local_f8);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus deviceWaitForEventCase (Context& context)
{
	const DeviceInterface&			vk					= context.getDeviceInterface();
	const VkDevice					device				= context.getDevice();
	const VkQueue					queue				= context.getUniversalQueue();
	const deUint32					queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	const Unique<VkFence>			fence				(createFence(vk, device));
	const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer			(makeCommandBuffer(vk, device, *cmdPool));
	const VkSubmitInfo				submitInfo			=
														{
															VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType				sType;
															DE_NULL,						// const void*					pNext;
															0u,								// deUint32						waitSemaphoreCount;
															DE_NULL,						// const VkSemaphore*			pWaitSemaphores;
															DE_NULL,						// const VkPipelineStageFlags*	pWaitDstStageMask;
															1u,								// deUint32						commandBufferCount;
															&cmdBuffer.get(),				// const VkCommandBuffer*		pCommandBuffers;
															0u,								// deUint32						signalSemaphoreCount;
															DE_NULL,						// const VkSemaphore*			pSignalSemaphores;
														};
	const VkEventCreateInfo			eventInfo			=
														{
															VK_STRUCTURE_TYPE_EVENT_CREATE_INFO,
															DE_NULL,
															0
														};
	const Unique<VkEvent>			event				(createEvent(vk, device, &eventInfo, DE_NULL));

	beginCommandBuffer(vk, *cmdBuffer);
	vk.cmdWaitEvents(*cmdBuffer, 1u, &event.get(), VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_ALL_COMMANDS_BIT, 0u, DE_NULL, 0u, DE_NULL, 0u, DE_NULL);
	endCommandBuffer(vk, *cmdBuffer);

	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence));
	if (VK_TIMEOUT != vk.waitForFences(device, 1u, &fence.get(), DE_TRUE, SHORT_FENCE_WAIT))
		return tcu::TestStatus::fail("Queue should not end execution");

	if (VK_SUCCESS != vk.setEvent(device, *event))
		return tcu::TestStatus::fail("Couldn't set event");

	if (VK_SUCCESS != vk.waitForFences(device, 1u, &fence.get(), DE_TRUE, LONG_FENCE_WAIT))
		return tcu::TestStatus::fail("Queue should end execution");

	return tcu::TestStatus::pass("Device wait for event tests pass");
}